

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O0

bool __thiscall cmParseBlanketJSCoverage::JSONParser::ParseFile(JSONParser *this,string *file)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  mapped_type *pmVar7;
  FileLinesType *CoverageVector;
  string local_320 [32];
  undefined1 local_300 [8];
  string result;
  FileLinesType *CoverageVector_1;
  long local_2a8;
  ifstream in;
  undefined1 local_a0 [8];
  string line;
  string covResult;
  undefined1 local_58 [6];
  bool inSource;
  bool foundFile;
  string filename;
  FileLinesType localCoverageVector;
  string *file_local;
  JSONParser *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)((long)&filename.field_2 + 8));
  std::__cxx11::string::string((string *)local_58);
  bVar1 = false;
  bVar2 = false;
  std::__cxx11::string::string((string *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_a0);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_2a8,pcVar5,_S_in);
  bVar3 = std::ios::operator!((ios *)((long)&local_2a8 + *(long *)(local_2a8 + -0x18)));
  if ((bVar3 & 1) == 0) {
    while (bVar4 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_2a8,(string *)local_a0,(bool *)0x0,
                              0xffffffffffffffff), bVar4) {
      lVar6 = std::__cxx11::string::find(local_a0,0xd95c32);
      if (lVar6 == -1) {
        lVar6 = std::__cxx11::string::find(local_a0,0xd11e8b);
        if (((lVar6 == -1) || (!bVar1)) || (!bVar2)) {
          lVar6 = std::__cxx11::string::find(local_a0,0xd57894);
          if (lVar6 != -1) {
            bVar2 = true;
          }
        }
        else {
          getValue((string *)local_300,this,(string *)local_a0,1);
          std::__cxx11::string::substr((ulong)local_320,(ulong)local_300);
          std::__cxx11::string::operator=((string *)local_300,local_320);
          std::__cxx11::string::~string(local_320);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_300,"\"\"");
          if (bVar4) {
            CoverageVector._4_4_ = 0xffffffff;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)((long)&filename.field_2 + 8),
                       (value_type_conflict2 *)((long)&CoverageVector + 4));
          }
          else {
            pcVar5 = (char *)std::__cxx11::string::c_str();
            CoverageVector._0_4_ = atoi(pcVar5);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)((long)&filename.field_2 + 8),
                       (value_type_conflict2 *)&CoverageVector);
          }
          std::__cxx11::string::~string((string *)local_300);
        }
      }
      else {
        if (bVar1) {
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[](&this->Coverage->TotalCoverage,(key_type *)local_58);
          std::vector<int,_std::allocator<int>_>::operator=
                    (pmVar7,(vector<int,_std::allocator<int>_> *)((long)&filename.field_2 + 8));
          std::vector<int,_std::allocator<int>_>::clear
                    ((vector<int,_std::allocator<int>_> *)((long)&filename.field_2 + 8));
        }
        bVar1 = true;
        bVar2 = false;
        getValue((string *)((long)&result.field_2 + 8),this,(string *)local_a0,0);
        std::__cxx11::string::operator=
                  ((string *)local_58,(string *)(result.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
      }
    }
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->Coverage->TotalCoverage,(key_type *)local_58);
    std::vector<int,_std::allocator<int>_>::operator=
              (pmVar7,(vector<int,_std::allocator<int>_> *)((long)&filename.field_2 + 8));
    std::vector<int,_std::allocator<int>_>::clear
              ((vector<int,_std::allocator<int>_> *)((long)&filename.field_2 + 8));
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_2a8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)((long)&filename.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool ParseFile(std::string const& file)
  {
    FileLinesType localCoverageVector;
    std::string filename;
    bool foundFile = false;
    bool inSource = false;
    std::string covResult;
    std::string line;

    cmsys::ifstream in(file.c_str());
    if (!in) {
      return false;
    }
    while (cmSystemTools::GetLineFromStream(in, line)) {
      if (line.find("filename") != std::string::npos) {
        if (foundFile) {
          /*
           * Upon finding a second file name, generate a
           * vector within the total coverage to capture the
           * information in the local vector
           */
          FileLinesType& CoverageVector =
            this->Coverage.TotalCoverage[filename];
          CoverageVector = localCoverageVector;
          localCoverageVector.clear();
        }
        foundFile = true;
        inSource = false;
        filename = this->getValue(line, 0);
      } else if ((line.find("coverage") != std::string::npos) && foundFile &&
                 inSource) {
        /*
         *  two types of "coverage" in the JSON structure
         *
         *  The coverage result over the file or set of files
         *  and the coverage for each individual line
         *
         *  FoundFile and foundSource ensure that
         *  only the value of the line coverage is captured
         */
        std::string result = this->getValue(line, 1);
        result = result.substr(2);
        if (result == "\"\"") {
          // Empty quotation marks indicate that the
          // line is not executable
          localCoverageVector.push_back(-1);
        } else {
          // Else, it contains the number of time executed
          localCoverageVector.push_back(atoi(result.c_str()));
        }
      } else if (line.find("source") != std::string::npos) {
        inSource = true;
      }
    }

    // On exit, capture end of last file covered.
    FileLinesType& CoverageVector = this->Coverage.TotalCoverage[filename];
    CoverageVector = localCoverageVector;
    localCoverageVector.clear();
    return true;
  }